

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemTable.cpp
# Opt level: O0

void __thiscall ItemTable::~ItemTable(ItemTable *this)

{
  bool bVar1;
  reference ppVar2;
  pair<const_itemType,_ItemWrapper_*> i;
  iterator __end1;
  iterator __begin1;
  ItemList *__range1;
  ItemTable *this_local;
  
  __end1 = std::
           map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
           ::begin(&this->items);
  i.second = (ItemWrapper *)
             std::
             map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
             ::end(&this->items);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&i.second);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_itemType,_ItemWrapper_*>_>::operator*(&__end1);
    i._0_8_ = ppVar2->second;
    free((void *)i._0_8_);
    std::_Rb_tree_iterator<std::pair<const_itemType,_ItemWrapper_*>_>::operator++(&__end1);
  }
  std::
  map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
  ::~map(&this->items);
  return;
}

Assistant:

ItemTable::~ItemTable(){
    for(auto i : items){
        free(i.second);
    }
}